

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

Measurement *
pospopcnt_wrapper<int(*)(unsigned_short_const*,unsigned_int,unsigned_int*),unsigned_short>
          (Measurement *__return_storage_ptr__,
          _func_int_unsigned_short_ptr_uint_uint_ptr *measured_function,
          _func_int_unsigned_short_ptr_uint_uint_ptr *reference_function,int iterations,
          unsigned_short *data,size_t n)

{
  int *piVar1;
  undefined8 uVar2;
  uint64_t rdtsc_start;
  int extraout_EAX;
  int iVar3;
  uint uVar4;
  clockdef start;
  clockdef end;
  undefined4 extraout_EDX;
  bool bVar5;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar6 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  StatisticsBuilder stats;
  uint32_t flags_truth [16];
  uint32_t counters [16];
  
  counters[0] = 0;
  counters[1] = 0;
  counters[2] = 0;
  counters[3] = 0;
  counters[4] = 0;
  counters[5] = 0;
  counters[6] = 0;
  counters[7] = 0;
  counters[8] = 0;
  counters[9] = 0;
  counters[10] = 0;
  counters[0xb] = 0;
  counters[0xc] = 0;
  counters[0xd] = 0;
  counters[0xe] = 0;
  counters[0xf] = 0;
  flags_truth[0] = 0;
  flags_truth[1] = 0;
  flags_truth[2] = 0;
  flags_truth[3] = 0;
  flags_truth[4] = 0;
  flags_truth[5] = 0;
  flags_truth[6] = 0;
  flags_truth[7] = 0;
  flags_truth[8] = 0;
  flags_truth[9] = 0;
  flags_truth[10] = 0;
  flags_truth[0xb] = 0;
  flags_truth[0xc] = 0;
  flags_truth[0xd] = 0;
  flags_truth[0xe] = 0;
  flags_truth[0xf] = 0;
  auVar7 = ZEXT1664(in_ZMM1._0_16_);
  StatisticsBuilder::StatisticsBuilder(&stats,(long)iterations);
  if (extraout_EAX == 0) {
    cpuid_basic_info(0);
  }
  else if (extraout_EAX == 1) {
    cpuid_Version_info(1);
  }
  else if (extraout_EAX == 2) {
    cpuid_cache_tlb_info(2);
  }
  else if (extraout_EAX == 3) {
    cpuid_serial_info(3);
  }
  else if (extraout_EAX == 4) {
    cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (extraout_EAX == 5) {
    cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (extraout_EAX == 6) {
    cpuid_Thermal_Power_Management_info(6);
  }
  else if (extraout_EAX == 7) {
    cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (extraout_EAX == 9) {
    cpuid_Direct_Cache_Access_info(9);
  }
  else if (extraout_EAX == 10) {
    cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (extraout_EAX == 0xb) {
    cpuid_Extended_Topology_info(0xb);
  }
  else if (extraout_EAX == 0xd) {
    cpuid_Processor_Extended_States_info(0xd);
  }
  else if (extraout_EAX == 0xf) {
    cpuid_Quality_of_Service_info(0xf);
  }
  else if (extraout_EAX == -0x7ffffffe) {
    cpuid_brand_part1_info(0x80000002);
  }
  else if (extraout_EAX == -0x7ffffffd) {
    cpuid_brand_part2_info(0x80000003);
  }
  else if (extraout_EAX == -0x7ffffffc) {
    cpuid_brand_part3_info(0x80000004);
  }
  else {
    cpuid(extraout_EAX);
  }
  uVar2 = rdtsc();
  iVar3 = (int)uVar2;
  rdtscp();
  if (iVar3 == 0) {
    piVar1 = (int *)cpuid_basic_info(0);
  }
  else if (iVar3 == 1) {
    piVar1 = (int *)cpuid_Version_info(1);
  }
  else if (iVar3 == 2) {
    piVar1 = (int *)cpuid_cache_tlb_info(2);
  }
  else if (iVar3 == 3) {
    piVar1 = (int *)cpuid_serial_info(3);
  }
  else if (iVar3 == 4) {
    piVar1 = (int *)cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (iVar3 == 5) {
    piVar1 = (int *)cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (iVar3 == 6) {
    piVar1 = (int *)cpuid_Thermal_Power_Management_info(6);
  }
  else if (iVar3 == 7) {
    piVar1 = (int *)cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (iVar3 == 9) {
    piVar1 = (int *)cpuid_Direct_Cache_Access_info(9);
  }
  else if (iVar3 == 10) {
    piVar1 = (int *)cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (iVar3 == 0xb) {
    piVar1 = (int *)cpuid_Extended_Topology_info(0xb);
  }
  else if (iVar3 == 0xd) {
    piVar1 = (int *)cpuid_Processor_Extended_States_info(0xd);
  }
  else if (iVar3 == 0xf) {
    piVar1 = (int *)cpuid_Quality_of_Service_info(0xf);
  }
  else if (iVar3 == -0x7ffffffe) {
    piVar1 = (int *)cpuid_brand_part1_info(0x80000002);
  }
  else if (iVar3 == -0x7ffffffd) {
    piVar1 = (int *)cpuid_brand_part2_info(0x80000003);
  }
  else if (iVar3 == -0x7ffffffc) {
    piVar1 = (int *)cpuid_brand_part3_info(0x80000004);
  }
  else {
    piVar1 = (int *)cpuid(iVar3);
  }
  iVar3 = *piVar1;
  if (iVar3 == 0) {
    cpuid_basic_info(0);
  }
  else if (iVar3 == 1) {
    cpuid_Version_info(1);
  }
  else if (iVar3 == 2) {
    cpuid_cache_tlb_info(2);
  }
  else if (iVar3 == 3) {
    cpuid_serial_info(3);
  }
  else if (iVar3 == 4) {
    cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (iVar3 == 5) {
    cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (iVar3 == 6) {
    cpuid_Thermal_Power_Management_info(6);
  }
  else if (iVar3 == 7) {
    cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (iVar3 == 9) {
    cpuid_Direct_Cache_Access_info(9);
  }
  else if (iVar3 == 10) {
    cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (iVar3 == 0xb) {
    cpuid_Extended_Topology_info(0xb);
  }
  else if (iVar3 == 0xd) {
    cpuid_Processor_Extended_States_info(0xd);
  }
  else if (iVar3 == 0xf) {
    cpuid_Quality_of_Service_info(0xf);
  }
  else if (iVar3 == -0x7ffffffe) {
    cpuid_brand_part1_info(0x80000002);
  }
  else if (iVar3 == -0x7ffffffd) {
    cpuid_brand_part2_info(0x80000003);
  }
  else if (iVar3 == -0x7ffffffc) {
    cpuid_brand_part3_info(0x80000004);
  }
  else {
    cpuid(iVar3);
  }
  uVar2 = rdtsc();
  iVar3 = (int)uVar2;
  rdtscp();
  if (iVar3 == 0) {
    cpuid_basic_info(0);
  }
  else if (iVar3 == 1) {
    cpuid_Version_info(1);
  }
  else if (iVar3 == 2) {
    cpuid_cache_tlb_info(2);
  }
  else if (iVar3 == 3) {
    cpuid_serial_info(3);
  }
  else if (iVar3 == 4) {
    cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (iVar3 == 5) {
    cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (iVar3 == 6) {
    cpuid_Thermal_Power_Management_info(6);
  }
  else if (iVar3 == 7) {
    cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (iVar3 == 9) {
    cpuid_Direct_Cache_Access_info(9);
  }
  else if (iVar3 == 10) {
    cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (iVar3 == 0xb) {
    cpuid_Extended_Topology_info(0xb);
  }
  else if (iVar3 == 0xd) {
    cpuid_Processor_Extended_States_info(0xd);
  }
  else if (iVar3 == 0xf) {
    cpuid_Quality_of_Service_info(0xf);
  }
  else if (iVar3 == -0x7ffffffe) {
    cpuid_brand_part1_info(0x80000002);
  }
  else if (iVar3 == -0x7ffffffd) {
    cpuid_brand_part2_info(0x80000003);
  }
  else if (iVar3 == -0x7ffffffc) {
    cpuid_brand_part3_info(0x80000004);
  }
  else {
    cpuid(iVar3);
  }
  uVar4 = ~(iterations >> 0x1f) & iterations;
  while( true ) {
    auVar6 = auVar7._0_16_;
    bVar5 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar5) break;
    counters[0] = 0;
    counters[1] = 0;
    counters[2] = 0;
    counters[3] = 0;
    counters[4] = 0;
    counters[5] = 0;
    counters[6] = 0;
    counters[7] = 0;
    counters[8] = 0;
    counters[9] = 0;
    counters[10] = 0;
    counters[0xb] = 0;
    counters[0xc] = 0;
    counters[0xd] = 0;
    counters[0xe] = 0;
    counters[0xf] = 0;
    flags_truth[0] = 0;
    flags_truth[1] = 0;
    flags_truth[2] = 0;
    flags_truth[3] = 0;
    flags_truth[4] = 0;
    flags_truth[5] = 0;
    flags_truth[6] = 0;
    flags_truth[7] = 0;
    flags_truth[8] = 0;
    flags_truth[9] = 0;
    flags_truth[10] = 0;
    flags_truth[0xb] = 0;
    flags_truth[0xc] = 0;
    flags_truth[0xd] = 0;
    flags_truth[0xe] = 0;
    flags_truth[0xf] = 0;
    generate_random_data<unsigned_short>(data,n);
    (*reference_function)(data,(uint)n,flags_truth);
    start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    iVar3 = (int)start.__d.__r;
    if (iVar3 == 0) {
      cpuid_basic_info(0);
    }
    else if (iVar3 == 1) {
      cpuid_Version_info(1);
    }
    else if (iVar3 == 2) {
      cpuid_cache_tlb_info(2);
    }
    else if (iVar3 == 3) {
      cpuid_serial_info(3);
    }
    else if (iVar3 == 4) {
      cpuid_Deterministic_Cache_Parameters_info(4);
    }
    else if (iVar3 == 5) {
      cpuid_MONITOR_MWAIT_Features_info(5);
    }
    else if (iVar3 == 6) {
      cpuid_Thermal_Power_Management_info(6);
    }
    else if (iVar3 == 7) {
      cpuid_Extended_Feature_Enumeration_info(7);
    }
    else if (iVar3 == 9) {
      cpuid_Direct_Cache_Access_info(9);
    }
    else if (iVar3 == 10) {
      cpuid_Architectural_Performance_Monitoring_info(10);
    }
    else if (iVar3 == 0xb) {
      cpuid_Extended_Topology_info(0xb);
    }
    else if (iVar3 == 0xd) {
      cpuid_Processor_Extended_States_info(0xd);
    }
    else if (iVar3 == 0xf) {
      cpuid_Quality_of_Service_info(0xf);
    }
    else if (iVar3 == -0x7ffffffe) {
      cpuid_brand_part1_info(0x80000002);
    }
    else if (iVar3 == -0x7ffffffd) {
      cpuid_brand_part2_info(0x80000003);
    }
    else if (iVar3 == -0x7ffffffc) {
      cpuid_brand_part3_info(0x80000004);
    }
    else {
      cpuid(iVar3);
    }
    rdtsc_start = rdtsc();
    iVar3 = (*measured_function)(data,(uint)n,counters);
    rdtscp();
    if (iVar3 == 0) {
      cpuid_basic_info(0);
    }
    else if (iVar3 == 1) {
      cpuid_Version_info(1);
    }
    else if (iVar3 == 2) {
      cpuid_cache_tlb_info(2);
    }
    else if (iVar3 == 3) {
      cpuid_serial_info(3);
    }
    else if (iVar3 == 4) {
      cpuid_Deterministic_Cache_Parameters_info(4);
    }
    else if (iVar3 == 5) {
      cpuid_MONITOR_MWAIT_Features_info(5);
    }
    else if (iVar3 == 6) {
      cpuid_Thermal_Power_Management_info(6);
    }
    else if (iVar3 == 7) {
      cpuid_Extended_Feature_Enumeration_info(7);
    }
    else if (iVar3 == 9) {
      cpuid_Direct_Cache_Access_info(9);
    }
    else if (iVar3 == 10) {
      cpuid_Architectural_Performance_Monitoring_info(10);
    }
    else if (iVar3 == 0xb) {
      cpuid_Extended_Topology_info(0xb);
    }
    else if (iVar3 == 0xd) {
      cpuid_Processor_Extended_States_info(0xd);
    }
    else if (iVar3 == 0xf) {
      cpuid_Quality_of_Service_info(0xf);
    }
    else if (iVar3 == -0x7ffffffe) {
      cpuid_brand_part1_info(0x80000002);
    }
    else if (iVar3 == -0x7ffffffd) {
      cpuid_brand_part2_info(0x80000003);
    }
    else if (iVar3 == -0x7ffffffc) {
      cpuid_brand_part3_info(0x80000004);
    }
    else {
      cpuid(iVar3);
    }
    end.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    auVar7._8_56_ = extraout_var;
    auVar7._0_8_ = extraout_XMM1_Qa;
    assert_truth(counters,flags_truth,0x10);
    StatisticsBuilder::add_record(&stats,start,end,rdtsc_start,CONCAT44(extraout_EDX,iVar3));
  }
  StatisticsBuilder::calculate(__return_storage_ptr__,&stats);
  __return_storage_ptr__->count = n;
  __return_storage_ptr__->size = n * 2;
  auVar6 = vcvtusi2sd_avx512f(auVar6,n * 2);
  __return_storage_ptr__->throughput =
       (auVar6._0_8_ * 9.5367431640625e-07) / ((__return_storage_ptr__->time).mean / 1000000000.0);
  StatisticsBuilder::~StatisticsBuilder(&stats);
  return __return_storage_ptr__;
}

Assistant:

Measurement pospopcnt_wrapper(
    pospopcnt_function_type measured_function,
    pospopcnt_function_type reference_function,
    int iterations,
    ItemType* data,
    size_t n)
{
    static_assert(std::is_unsigned<ItemType>::value, "ItemType must be an unsigned type");
    constexpr const int flags_count = pospopcnt_flags_count<ItemType>::value;

    // Set counters to 0.
    uint32_t counters[flags_count] = {0};
    uint32_t flags_truth[flags_count] = {0};

    uint32_t cycles_low = 0, cycles_high = 0;
    uint32_t cycles_low1 = 0, cycles_high1 = 0;
    // Start timer.
    
    StatisticsBuilder stats(iterations);

#ifndef _MSC_VER
// Intel guide:
// @see: https://www.intel.com/content/dam/www/public/us/en/documents/white-papers/ia-32-ia-64-benchmark-code-execution-paper.pdf
asm   volatile ("CPUID\n\t"
                "RDTSC\n\t"
                "mov %%edx, %0\n\t"
                "mov %%eax, %1\n\t": "=r" (cycles_high), "=r" (cycles_low):: "%rax", "%rbx", "%rcx", "%rdx"); 
asm   volatile("RDTSCP\n\t"
               "mov %%edx, %0\n\t"
               "mov %%eax, %1\n\t"
               "CPUID\n\t": "=r" (cycles_high1), "=r" (cycles_low1):: "%rax", "%rbx", "%rcx", "%rdx"); 
asm   volatile ("CPUID\n\t"
                "RDTSC\n\t"
                "mov %%edx, %0\n\t"
                "mov %%eax, %1\n\t": "=r" (cycles_high), "=r" (cycles_low):: "%rax", "%rbx", "%rcx", "%rdx"); 
asm   volatile("RDTSCP\n\t"
               "mov %%edx, %0\n\t"
               "mov %%eax, %1\n\t"
               "CPUID\n\t": "=r" (cycles_high1), "=r" (cycles_low1):: "%rax", "%rbx", "%rcx", "%rdx");
#endif

    for (int i = 0; i < iterations; ++i) {
        memset(counters, 0, sizeof(counters));
        memset(flags_truth, 0, sizeof(flags_truth));
        generate_random_data(data, n);

        reference_function(data, n, flags_truth);

        const clockdef t1 = std::chrono::high_resolution_clock::now();

#ifndef _MSC_VER 
    asm   volatile ("CPUID\n\t"
                    "RDTSC\n\t"
                    "mov %%edx, %0\n\t"
                    "mov %%eax, %1\n\t": "=r" (cycles_high), "=r" (cycles_low):: "%rax", "%rbx", "%rcx", "%rdx");
#endif
    // Call argument subroutine pointer.
    measured_function(data, n, counters);

#ifndef _MSC_VER 
    asm   volatile("RDTSCP\n\t"
                   "mov %%edx, %0\n\t"
                   "mov %%eax, %1\n\t"
                   "CPUID\n\t": "=r" (cycles_high1), "=r" (cycles_low1):: "%rax", "%rbx", "%rcx", "%rdx");
#endif

        const clockdef t2 = std::chrono::high_resolution_clock::now();

        assert_truth(counters, flags_truth, flags_count);

#define RDTSC_u64(high, low) (((uint64_t)(high) << 32)|(low))
        stats.add_record(t1, t2, RDTSC_u64(cycles_high, cycles_low), RDTSC_u64(cycles_high1, cycles_low1));
#undef RDTSC_u64
    }

    auto meas       = stats.calculate();
    meas.count      = n;
    meas.size       = meas.count * sizeof(ItemType);
    meas.throughput = (meas.size / (1024*1024.0)) / (meas.time.mean / 1000000000.0);

    return meas;
}